

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_std::tuple<mp::LogicalCountExpr>_&> *
testing::A<std::tuple<mp::LogicalCountExpr>const&>(void)

{
  MatcherInterface<const_std::tuple<mp::LogicalCountExpr>_&> *pMVar1;
  Matcher<const_std::tuple<mp::LogicalCountExpr>_&> *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tuple<mp::LogicalCountExpr>_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001cdef8;
  (in_RDI->super_MatcherBase<const_std::tuple<mp::LogicalCountExpr>_&>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<const_std::tuple<mp::LogicalCountExpr>_&>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<const_std::tuple<mp::LogicalCountExpr>_&>).impl_.link_;
  (in_RDI->super_MatcherBase<const_std::tuple<mp::LogicalCountExpr>_&>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001cdec0;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }